

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<32U,_16U,_buffer_layout_bfs>::operator()
          (fill<32U,_16U,_buffer_layout_bfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  size_t sVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  array<unsigned_long,_32UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_32UL> *streams_local;
  fill<32U,_16U,_buffer_layout_bfs> *this_local;
  long local_38;
  size_t n_1;
  size_t n;
  size_t empty;
  
  pvVar6 = std::array<unsigned_long,_32UL>::operator[](buffer_count,0x10);
  if (*pvVar6 != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 32U, I = 16U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
  sVar1 = pvVar7->n;
  pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
  if (sVar1 + pvVar7->n < 8) {
    pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
    sVar1 = pvVar7->n;
    pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
    lVar8 = (8 - sVar1) - pvVar7->n;
    n_1 = 8;
    pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
    sVar1 = n_1;
    if (pvVar7->n == 0) {
LAB_0015fad5:
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x624 - n_1));
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_32UL>::operator[](buffer_count,0x10);
      *pvVar6 = 8 - lVar8;
    }
    else {
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      if (pvVar7->n != 0) {
        do {
          pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            buffer[lVar8 + (0x624 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) goto LAB_0015fad5;
          }
          else {
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            buffer[lVar8 + (0x624 - n_1)] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            sVar1 = n_1 - 1;
            if (pvVar7->n == 0) break;
          }
          n_1 = n_1 - 1;
        } while( true );
      }
      n_1 = sVar1;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
      ppuVar2 = pvVar7->stream;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,ppuVar2 + pvVar7->n,buffer + lVar8 + (0x624 - n_1));
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
      pvVar7->n = 0;
      pvVar6 = std::array<unsigned_long,_32UL>::operator[](buffer_count,0x10);
      *pvVar6 = 8 - lVar8;
      check_input(buffer + lVar8 + 0x61c,8 - lVar8);
    }
  }
  else {
    local_38 = 8;
    pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
    lVar8 = local_38;
    if (pvVar7->n == 0) {
LAB_0015fe45:
      local_38 = lVar8;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      ppuVar4 = pvVar7->stream;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      std::copy<unsigned_char**,unsigned_char**>
                (ppuVar4,pvVar7->stream + local_38,buffer + (0x624 - local_38));
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      pvVar7->n = pvVar7->n - local_38;
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      pvVar7->stream = pvVar7->stream + local_38;
      pvVar6 = std::array<unsigned_long,_32UL>::operator[](buffer_count,0x10);
      *pvVar6 = 8;
      check_input(buffer + 0x61c,8);
    }
    else {
      pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
      if (pvVar7->n == 0) {
LAB_0015ff25:
        local_38 = lVar8;
        pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
        ppuVar4 = pvVar7->stream;
        pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
        std::copy<unsigned_char**,unsigned_char**>
                  (ppuVar4,pvVar7->stream + local_38,buffer + (0x624 - local_38));
        pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
        pvVar7->n = pvVar7->n - local_38;
        pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
        pvVar7->stream = pvVar7->stream + local_38;
        pvVar6 = std::array<unsigned_long,_32UL>::operator[](buffer_count,0x10);
        *pvVar6 = 8;
        check_input(buffer + 0x61c,8);
      }
      else {
        for (; local_38 != 0; local_38 = local_38 + -1) {
          pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
          puVar3 = *pvVar7->stream;
          pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
          iVar5 = cmp(puVar3,*pvVar7->stream);
          if (iVar5 < 1) {
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            buffer[0x624 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,0);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0015fe45;
          }
          else {
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            buffer[0x624 - local_38] = *pvVar7->stream;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            pvVar7->stream = pvVar7->stream + 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            pvVar7->n = pvVar7->n - 1;
            pvVar7 = std::array<Stream,_32UL>::operator[](streams,1);
            lVar8 = local_38 + -1;
            if (pvVar7->n == 0) goto LAB_0015ff25;
          }
        }
        pvVar6 = std::array<unsigned_long,_32UL>::operator[](buffer_count,0x10);
        *pvVar6 = 8;
        check_input(buffer + 0x61c,8);
      }
    }
  }
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}